

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QIntC.hh
# Opt level: O0

uchar QIntC::IntConverter<int,_unsigned_char,_true,_false>::convert(int *i)

{
  uint uVar1;
  byte bVar2;
  type ii;
  int *i_local;
  
  uVar1 = *i;
  if (-1 < *i) {
    bVar2 = std::numeric_limits<unsigned_char>::max();
    if (uVar1 <= bVar2) goto LAB_003bb0b0;
  }
  error(*i);
LAB_003bb0b0:
  return (uchar)*i;
}

Assistant:

inline static To
        convert(From const& i)
        {
            // From is signed, and To is unsigned. If i > 0, it's safe to
            // convert it to the corresponding unsigned type and to
            // compare with To's max.
            auto ii = static_cast<typename to_u<From>::type>(i);
            if ((i < 0) || (ii > std::numeric_limits<To>::max())) {
                error(i);
            }
            return static_cast<To>(i);
        }